

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_extract_tet(REF_GRID ref_grid,REF_CELL *ref_cell_ptr)

{
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL check_faces;
  REF_BOOL check_volume;
  REF_CELL ref_cell;
  REF_INT nodes [27];
  int local_24;
  REF_INT cell;
  REF_CELL *ref_cell_ptr_local;
  REF_GRID ref_grid_local;
  
  ref_grid_local._4_4_ = ref_cell_deep_copy(ref_cell_ptr,ref_grid->cell[8]);
  if (ref_grid_local._4_4_ == 0) {
    ref_cell_00 = *ref_cell_ptr;
    for (local_24 = 0; local_24 < ref_grid->cell[9]->max; local_24 = local_24 + 1) {
      RVar1 = ref_cell_nodes(ref_grid->cell[9],local_24,(REF_INT *)&ref_cell);
      if ((RVar1 == 0) &&
         (uVar2 = ref_shard_add_pyr_as_tet(ref_grid->node,ref_cell_00,(REF_INT *)&ref_cell,0),
         uVar2 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x48c,"ref_shard_extract_tet",(ulong)uVar2,"converts pyr to tets");
        return uVar2;
      }
    }
    for (local_24 = 0; local_24 < ref_grid->cell[10]->max; local_24 = local_24 + 1) {
      RVar1 = ref_cell_nodes(ref_grid->cell[10],local_24,(REF_INT *)&ref_cell);
      if ((RVar1 == 0) &&
         (uVar2 = ref_shard_add_pri_as_tet(ref_grid->node,ref_cell_00,(REF_INT *)&ref_cell,0),
         uVar2 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x492,"ref_shard_extract_tet",(ulong)uVar2,"converts pri to tets");
        return uVar2;
      }
    }
    for (local_24 = 0; local_24 < ref_grid->cell[0xb]->max; local_24 = local_24 + 1) {
      RVar1 = ref_cell_nodes(ref_grid->cell[0xb],local_24,(REF_INT *)&ref_cell);
      if ((RVar1 == 0) &&
         (uVar2 = ref_shard_add_hex_as_tet(ref_grid->node,ref_cell_00,(REF_INT *)&ref_cell),
         uVar2 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x497,"ref_shard_extract_tet",(ulong)uVar2,"converts hex to tets");
        return uVar2;
      }
    }
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x485,
           "ref_shard_extract_tet",(ulong)ref_grid_local._4_4_,"deep tri copy");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_shard_extract_tet(REF_GRID ref_grid,
                                         REF_CELL *ref_cell_ptr) {
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL ref_cell;
  REF_BOOL check_volume = REF_FALSE;
  REF_BOOL check_faces = REF_FALSE;

  if (check_faces)
    RSS(ref_shard_verify_faces(ref_grid, ref_grid_tet(ref_grid)), "orig tet");

  RSS(ref_cell_deep_copy(ref_cell_ptr, ref_grid_tet(ref_grid)),
      "deep tri copy");
  ref_cell = *ref_cell_ptr;
  if (check_faces)
    RSS(ref_shard_verify_faces(ref_grid, ref_cell), "deep copy tet");
  each_ref_cell_valid_cell_with_nodes(ref_grid_pyr(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pyr_as_tet(ref_grid_node(ref_grid), ref_cell, nodes,
                                 check_volume),
        "converts pyr to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add pyr");
  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pri_as_tet(ref_grid_node(ref_grid), ref_cell, nodes,
                                 check_volume),
        "converts pri to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add pri");
  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_grid), cell, nodes) {
    RSS(ref_shard_add_hex_as_tet(ref_grid_node(ref_grid), ref_cell, nodes),
        "converts hex to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add hex");

  return REF_SUCCESS;
}